

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O3

void tcg_gen_andc_vec_tricore
               (TCGContext_conflict9 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b)

{
  ushort uVar1;
  TCGOp *pTVar2;
  uintptr_t o_2;
  uintptr_t o_1;
  
  uVar1 = *(ushort *)((undefined1 *)((long)&tcg_ctx->pool_cur + 2) + (long)r);
  pTVar2 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_andc_vec);
  pTVar2->field_0x1 = (byte)((uint)uVar1 * 0x100 + 0xe00 >> 8) & 0xf;
  pTVar2->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar2->args[1] = (TCGArg)(a + (long)tcg_ctx);
  pTVar2->args[2] = (TCGArg)(b + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_andc_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    if (TCG_TARGET_HAS_andc_vec) {
        vec_gen_op3(tcg_ctx, INDEX_op_andc_vec, 0, r, a, b);
    } else {
        TCGv_vec t = tcg_temp_new_vec_matching(tcg_ctx, r);
        tcg_gen_not_vec(tcg_ctx, 0, t, b);
        tcg_gen_and_vec(tcg_ctx, 0, r, a, t);
        tcg_temp_free_vec(tcg_ctx, t);
    }
}